

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

_Bool ts_node_child_iterator_next(NodeChildIterator *self,TSNode *result)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  SubtreeHeapData *pSVar4;
  Subtree *pSVar5;
  uint uVar7;
  undefined4 uVar8;
  TSTree *pTVar6;
  undefined4 uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint32_t uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined4 uStack_24;
  undefined4 uStack_14;
  Length result_1;
  
  pSVar4 = (self->parent).ptr;
  if ((pSVar4 != (SubtreeHeapData *)0x0) &&
     (uVar12 = (ulong)self->child_index, self->child_index != pSVar4->child_count)) {
    pSVar5 = (pSVar4->field_17).field_0.children;
    pSVar4 = pSVar5[uVar12].ptr;
    if (((ulong)pSVar4 & 1) == 0) {
      uVar1 = *(uint *)&pSVar4->field_0x2c >> 2;
    }
    else {
      uVar1 = (uint)((ulong)pSVar4 >> 3) & 0x1fffffff;
    }
    uVar11 = 0;
    if ((uVar1 & 1) == 0) {
      if (self->alias_sequence == (TSSymbol *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint)self->alias_sequence[self->structural_child_index];
      }
      self->structural_child_index = self->structural_child_index + 1;
    }
    pSVar5 = pSVar5 + uVar12;
    if (uVar12 == 0) {
      uVar16._0_4_ = (self->position).bytes;
      uVar16._4_4_ = (self->position).extent.row;
      uVar15 = (self->position).extent.column;
    }
    else {
      pSVar4 = pSVar5->ptr;
      if (((ulong)pSVar4 & 1) == 0) {
        uVar1 = (pSVar4->padding).bytes;
        uVar7 = (pSVar4->padding).extent.row;
        uVar15 = (pSVar4->padding).extent.column;
      }
      else {
        uVar1 = (uint)((ulong)pSVar4 >> 0x10) & 0xff;
        uVar10 = (uint)((ulong)pSVar4 >> 0x20);
        uVar7 = uVar10 >> 8 & 0xf;
        uVar15 = uVar10 & 0xff;
      }
      uVar2 = (self->position).bytes;
      uVar8 = (self->position).extent.row;
      uVar17 = CONCAT44((self->position).extent.column,uVar8) + CONCAT44(uVar15,uVar7);
      uVar12 = uVar17 & 0xffffffff | (ulong)uVar15 << 0x20;
      if (uVar7 == 0) {
        uVar12 = uVar17;
      }
      uStack_14 = (undefined4)uVar12;
      uVar16 = CONCAT44(uStack_14,uVar1 + uVar2);
      uVar15 = (uint32_t)(uVar12 >> 0x20);
      (self->position).bytes = uVar1 + uVar2;
      (self->position).extent.row = uStack_14;
      (self->position).extent.column = uVar15;
    }
    pTVar6 = self->tree;
    result->context[0] = (uint32_t)uVar16;
    result->context[1] = (uint32_t)((ulong)uVar16 >> 0x20);
    result->context[2] = uVar15;
    result->context[3] = uVar11;
    result->id = pSVar5;
    result->tree = pTVar6;
    pSVar4 = pSVar5->ptr;
    if (((ulong)pSVar4 & 1) == 0) {
      uVar12._0_4_ = (pSVar4->size).bytes;
      uVar12._4_4_ = (pSVar4->size).extent.row;
      uVar1 = (pSVar4->size).extent.column;
      iVar14 = uVar12._4_4_;
    }
    else {
      uVar12 = (ulong)pSVar4 >> 0x18 & 0xff;
      uVar1 = (uint)uVar12;
      iVar14 = 0;
    }
    uVar3 = (self->position).bytes;
    uVar9 = (self->position).extent.row;
    uVar13 = CONCAT44((self->position).extent.column,uVar9) + CONCAT44(uVar1,iVar14);
    uVar17 = uVar13 & 0xffffffff | (ulong)uVar1 << 0x20;
    if (iVar14 == 0) {
      uVar17 = uVar13;
    }
    uStack_14 = (undefined4)uVar17;
    (self->position).bytes = uVar3 + (int)uVar12;
    (self->position).extent.row = uStack_14;
    (self->position).extent.column = (uint32_t)(uVar17 >> 0x20);
    self->child_index = self->child_index + 1;
    return true;
  }
  return false;
}

Assistant:

static inline bool ts_node_child_iterator_next(NodeChildIterator *self, TSNode *result) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  TSSymbol alias_symbol = 0;
  if (!ts_subtree_extra(*child)) {
    if (self->alias_sequence) {
      alias_symbol = self->alias_sequence[self->structural_child_index];
    }
    self->structural_child_index++;
  }
  if (self->child_index > 0) {
    self->position = length_add(self->position, ts_subtree_padding(*child));
  }
  *result = ts_node_new(
    self->tree,
    child,
    self->position,
    alias_symbol
  );
  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  return true;
}